

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# init.c
# Opt level: O1

parser_error parse_shape_name(parser *p)

{
  ushort uVar1;
  void *pvVar2;
  undefined8 *v;
  long lVar3;
  char *pcVar4;
  
  pvVar2 = parser_priv(p);
  v = (undefined8 *)mem_zalloc(0x118);
  lVar3 = 0x24;
  do {
    *(undefined2 *)((long)v + lVar3 * 4) = 100;
    lVar3 = lVar3 + 1;
  } while (lVar3 != 0x40);
  *v = pvVar2;
  pcVar4 = parser_getstr(p,"name");
  pcVar4 = string_make(pcVar4);
  v[1] = pcVar4;
  parser_setpriv(p,v);
  uVar1 = z_info->shape_max;
  z_info->shape_max = uVar1 + 1;
  *(uint *)(v + 2) = (uint)uVar1;
  return PARSE_ERROR_NONE;
}

Assistant:

static enum parser_error parse_shape_name(struct parser *p) {
	struct player_shape *h = parser_priv(p);
	struct player_shape *shape = mem_zalloc(sizeof *shape);
	int i;

	for (i = 0; i < ELEM_MAX; i++) {
		shape->el_info[i].res_level = RES_LEVEL_BASE;
	}
	shape->next = h;
	shape->name = string_make(parser_getstr(p, "name"));
	parser_setpriv(p, shape);
	shape->sidx = z_info->shape_max++;
	return PARSE_ERROR_NONE;
}